

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O1

void anon_unknown.dwarf_4ac5::Test_TemplateDictionary_ShowSection::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  char *pcVar13;
  bool bVar14;
  int iVar15;
  undefined8 extraout_RAX;
  char *pcVar16;
  TemplateDictionaryPeer subdict_peer;
  string dump;
  TemplateDictionary dict;
  TemplateDictionaryPeer local_268;
  char *local_260;
  undefined8 uStack_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined8 uStack_248;
  char *local_240;
  undefined8 uStack_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  undefined8 uStack_228;
  char *local_220;
  undefined8 uStack_218;
  undefined1 local_210;
  undefined7 uStack_20f;
  undefined8 uStack_208;
  char *local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0;
  undefined7 uStack_1ef;
  undefined8 uStack_1e8;
  char *local_1e0;
  undefined8 uStack_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  undefined8 uStack_1c8;
  char *local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined8 uStack_1a8;
  char *local_1a0;
  undefined8 uStack_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  undefined8 uStack_188;
  char *local_180;
  undefined8 uStack_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined8 uStack_168;
  char *local_160;
  undefined8 uStack_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  undefined8 uStack_148;
  char *local_140;
  undefined8 uStack_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  char *local_120;
  undefined8 uStack_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  char *local_100;
  undefined8 uStack_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  TemplateString local_e0;
  TemplateDictionary local_c0 [112];
  TemplateString local_50;
  
  local_e0.ptr_ = "test_SetShowSection";
  local_e0.length_ = 0x13;
  local_e0.is_immutable_ = true;
  local_e0.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary(local_c0,&local_e0,(UnsafeArena *)0x0);
  local_100 = "bigmamainclude!.tpl";
  uStack_f8 = 0x13;
  local_f0 = 1;
  uStack_e8 = 0;
  TVar1._17_7_ = uStack_ef;
  TVar1.is_immutable_ = true;
  TVar1.length_ = 0x13;
  TVar1.ptr_ = "bigmamainclude!.tpl";
  TVar1.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar1);
  local_120 = "TOPLEVEL";
  uStack_118 = 8;
  local_110 = 1;
  uStack_108 = 0;
  local_140 = "foo";
  uStack_138 = 3;
  local_130 = 1;
  uStack_128 = 0;
  TVar10._17_7_ = uStack_12f;
  TVar10.is_immutable_ = true;
  TVar2._17_7_ = uStack_10f;
  TVar2.is_immutable_ = true;
  TVar2.length_ = 8;
  TVar2.ptr_ = "TOPLEVEL";
  TVar2.id_ = 0;
  TVar10.length_ = 3;
  TVar10.ptr_ = "foo";
  TVar10.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar10);
  local_160 = "TOPLEVEL2";
  uStack_158 = 9;
  local_150 = 1;
  uStack_148 = 0;
  local_180 = "foo2";
  uStack_178 = 4;
  local_170 = 1;
  uStack_168 = 0;
  TVar11._17_7_ = uStack_16f;
  TVar11.is_immutable_ = true;
  TVar3._17_7_ = uStack_14f;
  TVar3.is_immutable_ = true;
  TVar3.length_ = 9;
  TVar3.ptr_ = "TOPLEVEL2";
  TVar3.id_ = 0;
  TVar11.length_ = 4;
  TVar11.ptr_ = "foo2";
  TVar11.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar3,TVar11);
  local_1a0 = "section1";
  uStack_198 = 8;
  local_190 = 1;
  uStack_188 = 0;
  TVar4._17_7_ = uStack_18f;
  TVar4.is_immutable_ = true;
  TVar4.length_ = 8;
  TVar4.ptr_ = "section1";
  TVar4.id_ = 0;
  ctemplate::TemplateDictionary::ShowSection(TVar4);
  local_1c0 = "section2";
  uStack_1b8 = 8;
  local_1b0 = 1;
  uStack_1a8 = 0;
  TVar5._17_7_ = uStack_1af;
  TVar5.is_immutable_ = true;
  TVar5.length_ = 8;
  TVar5.ptr_ = "section2";
  TVar5.id_ = 0;
  ctemplate::TemplateDictionary::ShowSection(TVar5);
  local_1e0 = "section2";
  uStack_1d8 = 8;
  local_1d0 = 1;
  uStack_1c8 = 0;
  TVar6._17_7_ = uStack_1cf;
  TVar6.is_immutable_ = true;
  TVar6.length_ = 8;
  TVar6.ptr_ = "section2";
  TVar6.id_ = 0;
  ctemplate::TemplateDictionary::ShowSection(TVar6);
  pcVar16 = "section3";
  local_200 = "section3";
  uStack_1f8 = 8;
  local_1f0 = 1;
  uStack_1e8 = 0;
  TVar7._17_7_ = uStack_1ef;
  TVar7.is_immutable_ = true;
  TVar7.length_ = 8;
  TVar7.ptr_ = "section3";
  TVar7.id_ = 0;
  local_268.dict_ = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar7)
  ;
  local_220 = "TOPLEVEL";
  uStack_218 = 8;
  local_210 = 1;
  uStack_208 = 0;
  local_240 = "bar";
  uStack_238 = 3;
  local_230 = 1;
  uStack_228 = 0;
  TVar12._17_7_ = uStack_22f;
  TVar12.is_immutable_ = true;
  TVar8._17_7_ = uStack_20f;
  TVar8.is_immutable_ = true;
  TVar8.length_ = 8;
  TVar8.ptr_ = "TOPLEVEL";
  TVar8.id_ = 0;
  TVar12.length_ = 3;
  TVar12.ptr_ = "bar";
  TVar12.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar8,TVar12);
  local_260 = "section3";
  uStack_258 = 8;
  local_250 = 1;
  uStack_248 = 0;
  TVar9._17_7_ = uStack_24f;
  TVar9.is_immutable_ = true;
  TVar9.length_ = 8;
  TVar9.ptr_ = "section3";
  TVar9.id_ = 0;
  ctemplate::TemplateDictionary::ShowSection(TVar9);
  local_e0.ptr_ = "TOPLEVEL";
  local_e0.length_ = 8;
  local_e0.is_immutable_ = true;
  local_e0.id_ = 0;
  local_50.ptr_ = "bar";
  local_50.length_ = 3;
  local_50.is_immutable_ = true;
  local_50.id_ = 0;
  bVar14 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_268,&local_e0,&local_50);
  if (bVar14) {
    pcVar16 = &local_e0.is_immutable_;
    local_e0.length_ = 0;
    local_e0.is_immutable_ = false;
    local_e0.ptr_ = pcVar16;
    ctemplate::TemplateDictionary::DumpToString((string *)local_c0,(int)&local_e0);
    pcVar13 = local_e0.ptr_;
    iVar15 = strcmp(local_e0.ptr_,
                    "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n};\ndictionary \'test_SetShowSection (intended for bigmamainclude!.tpl)\' {\n   TOPLEVEL: >foo<\n   TOPLEVEL2: >foo2<\n   section section1 (dict 1 of 1) -->\n     dictionary \'empty dictionary\' {\n     }\n   section section2 (dict 1 of 1) -->\n     dictionary \'empty dictionary\' {\n     }\n   section section3 (dict 1 of 1) -->\n     dictionary \'test_SetShowSection/section3#1\' {\n       TOPLEVEL: >bar<\n     }\n}\n"
                   );
    if (iVar15 == 0) {
      if (pcVar13 != pcVar16) {
        operator_delete(pcVar13);
      }
      ctemplate::TemplateDictionary::~TemplateDictionary(local_c0);
      return;
    }
  }
  else {
    _GLOBAL__N_1::Test_TemplateDictionary_ShowSection::Run();
  }
  _GLOBAL__N_1::Test_TemplateDictionary_ShowSection::Run();
  if (local_e0.ptr_ != pcVar16) {
    operator_delete(local_e0.ptr_);
  }
  ctemplate::TemplateDictionary::~TemplateDictionary(local_c0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateDictionary, SetValueWithoutCopy) {
  UnsafeArena arena(100);
  TemplateDictionary dict("Test arena", &arena);

  char value[32];
  snprintf(value, sizeof(value), "%s", "value");

  const void* const ptr = arena.Alloc(0);
  dict.SetValueWithoutCopy("key", value);
  // We shouldn't have copied the value string.
  EXPECT_EQ(ptr, arena.Alloc(0));

  TemplateDictionaryPeer peer(&dict);
  EXPECT_TRUE(peer.ValueIs("key", "value"));
  // If our content changes, so does what's in the dictionary -- but
  // only the contents of the buffer, not its length!
  snprintf(value, sizeof(value), "%s", "not_value");
  EXPECT_TRUE(peer.ValueIs("key", "not_v"));   // sizeof("not_v") == sizeof("value")
}